

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::line_end(Fl_Text_Display *this,int startPos,bool startPosIsLineStart)

{
  int iVar1;
  int maxPos;
  Fl_Text_Buffer *pFVar2;
  Fl_Text_Buffer *this_00;
  int local_38;
  int local_34;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  bool startPosIsLineStart_local;
  Fl_Text_Display *pFStack_20;
  int startPos_local;
  Fl_Text_Display *this_local;
  
  retPos._3_1_ = startPosIsLineStart;
  retLines = startPos;
  pFStack_20 = this;
  if (this->mContinuousWrap == 0) {
    pFVar2 = buffer(this);
    this_local._4_4_ = Fl_Text_Buffer::line_end(pFVar2,retLines);
  }
  else {
    pFVar2 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar2);
    if (startPos == iVar1) {
      this_local._4_4_ = retLines;
    }
    else {
      pFVar2 = buffer(this);
      iVar1 = retLines;
      this_00 = buffer(this);
      maxPos = Fl_Text_Buffer::length(this_00);
      wrapped_line_counter
                (this,pFVar2,iVar1,maxPos,1,(bool)(retPos._3_1_ & 1),0,&retLineEnd,&retLineStart,
                 &local_34,&local_38,true);
      this_local._4_4_ = local_38;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::line_end(int startPos, bool startPosIsLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping use more efficient BufEndOfLine */
  if (!mContinuousWrap)
    return buffer()->line_end(startPos);

  if (startPos == buffer()->length())
    return startPos;

  wrapped_line_counter(buffer(), startPos, buffer()->length(), 1,
                       startPosIsLineStart, 0, &retPos, &retLines, &retLineStart,
                       &retLineEnd);

  IS_UTF8_ALIGNED2(buffer(), retLineEnd)
  return retLineEnd;
}